

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O2

unsigned_short protodec_sdlc_crc(uchar *data,uint len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = 0xffff;
  while (bVar5 = len != 0, len = len - 1, bVar5) {
    for (uVar2 = *data | 0x100; 1 < uVar2; uVar2 = uVar2 >> 1) {
      uVar3 = uVar2 ^ uVar1;
      uVar4 = (uVar1 & 0xffff) >> 1;
      uVar1 = uVar4 ^ 0xffff8408;
      if ((uVar3 & 1) == 0) {
        uVar1 = uVar4;
      }
    }
    data = data + 1;
  }
  return ~(ushort)uVar1;
}

Assistant:

unsigned short protodec_sdlc_crc(const unsigned char *data, unsigned len)
{
	unsigned short c, crc = 0xffff;

	while (len--)
		for (c = 0x100 + *data++; c > 1; c >>= 1)
			if ((crc ^ c) & 1)
				crc = (crc >> 1) ^ 0x8408;
			else
				crc >>= 1;
	return ~crc;

}